

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::string_node(CTcEmbedBuilderSgl *this,CTcToken *tok)

{
  CTcPrsNode *pCVar1;
  CTcConstVal cval;
  
  cval.typ_ = TC_CVT_UNK;
  cval._32_1_ = 0;
  CTcConstVal::set_sstr(&cval,tok);
  pCVar1 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)tok);
  pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)CONCAT44(cval._4_4_,cval.typ_)
  ;
  pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cval.val_.intval_;
  pCVar1[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cval.val_.floatval_.len_;
  pCVar1[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cval.val_._16_8_;
  *(undefined1 *)&pCVar1[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = cval._32_1_;
  (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003505b8;
  return pCVar1;
}

Assistant:

CTcPrsNode *string_node(const CTcToken *tok)
    {
        CTcConstVal cval;
        cval.set_sstr(tok);
        return new CTPNConst(&cval);
    }